

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int encode_with_recode_loop_and_filter
              (AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,int64_t *sse,int64_t *rate,
              int *largest_tile_id)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  long *in_RSI;
  long *in_RDI;
  int64_t *in_R8;
  long *in_R9;
  DuckyEncodeFrameResult *frame_result;
  PSNR_STATS psnr;
  int64_t bits;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  int err;
  int i;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffef8;
  AV1_COMP *in_stack_ffffffffffffff00;
  long local_f8;
  AV1_COMP *in_stack_ffffffffffffff10;
  AV1_COMP *in_stack_ffffffffffffff20;
  long local_d8;
  AV1_COMMON *in_stack_ffffffffffffff50;
  AV1_COMP *in_stack_ffffffffffffff58;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff88;
  AV1_COMP *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  AV1_COMP *in_stack_ffffffffffffffa8;
  int local_40;
  int local_3c;
  int local_4;
  
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    *(undefined4 *)((long)in_RDI + (long)local_3c * 4 + 0x9ad94) = 0;
    *(undefined4 *)((long)in_RDI + (long)local_3c * 4 + 0x9adbc) = 0;
    *(undefined4 *)((long)in_RDI + (long)local_3c * 4 + 0x9ade4) = 0;
    *(undefined4 *)((long)in_RDI + (long)local_3c * 4 + 0x9ae0c) = 0;
  }
  *(undefined4 *)(in_RDI + 0x135c8) = 0;
  if (*(char *)((long)in_RDI + 0x608c4) == '\0') {
    local_40 = encode_without_recode(in_stack_ffffffffffffff90);
  }
  else {
    local_40 = encode_with_recode_loop
                         (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  }
  if (local_40 == 0) {
    lVar1 = in_RDI[0x8401];
    if ((*(int *)(*in_RDI + 0xac6c) != 0) && (*(int *)((long)in_RDI + 0x6079c) == 1)) {
      if (*(char *)(lVar1 + 0x4c) == '\0') {
        iVar3 = aom_get_y_sse((YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
        in_RDI[0x85e6] = iVar3;
      }
      else {
        iVar3 = aom_highbd_get_y_sse
                          ((YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
                          );
        in_RDI[0x85e6] = iVar3;
      }
    }
    *(undefined4 *)(in_RDI[0x780d] + 0x57c) = *(undefined4 *)(lVar1 + 0x50);
    *(undefined4 *)(in_RDI[0x780d] + 0x580) = *(undefined4 *)(lVar1 + 0x54);
    *(undefined4 *)(in_RDI[0x780d] + 0x584) = *(undefined4 *)(lVar1 + 0x58);
    *(undefined1 *)(in_RDI[0x780d] + 0x588) = *(undefined1 *)(lVar1 + 0x4d);
    *(undefined4 *)(in_RDI[0x780d] + 0x58c) = *(undefined4 *)(lVar1 + 0x68);
    *(undefined4 *)(in_RDI[0x780d] + 0x590) = *(undefined4 *)(lVar1 + 0x5c);
    *(int *)(in_RDI[0x780d] + 0x594) = (int)in_RDI[0x77f8];
    *(undefined4 *)(in_RDI[0x780d] + 0x598) = *(undefined4 *)((long)in_RDI + 0x3bfc4);
    if ((int)in_RDI[0x13a3d] == 0) {
      set_postproc_filter_default_params((AV1_COMMON *)(in_RDI + 0x77f0));
    }
    if ((*(byte *)(in_RDI + 0x782e) & 1) == 0) {
      loopfilter_frame(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    }
    if (((char)in_RDI[0x84ee] != '\x02') && (*(int *)(*in_RDI + 0x14dc4) == 0)) {
      extend_frame_borders(in_stack_ffffffffffffff10);
    }
    if (*(int *)((long)in_RDI + 0x4269c) == 2) {
      set_grain_syn_params((AV1_COMMON *)in_stack_ffffffffffffff00);
    }
    av1_finalize_encoded_frame(in_stack_ffffffffffffff20);
    *(undefined4 *)((long)in_RDI + 0x6077c) = 0;
    iVar2 = av1_pack_bitstream(in_stack_ffffffffffffffa8,(uint8_t *)in_stack_ffffffffffffffa0,
                               (size_t)in_stack_ffffffffffffff98,(size_t *)in_stack_ffffffffffffff90
                               ,in_stack_ffffffffffffff88);
    if (iVar2 == 0) {
      if (((*(int *)((long)in_RDI + 0x60824) == 0) ||
          (iVar2 = allow_postencode_drop_rtc(in_stack_ffffffffffffff00), iVar2 == 0)) ||
         (iVar2 = av1_postencode_drop_cbr
                            (in_stack_ffffffffffffff58,(size_t *)in_stack_ffffffffffffff50),
         iVar2 == 0)) {
        if (in_R8 != (int64_t *)0x0) {
          if (*(char *)(lVar1 + 0x4c) == '\0') {
            iVar3 = aom_get_y_sse((YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff00,
                                  in_stack_fffffffffffffef8);
          }
          else {
            iVar3 = aom_highbd_get_y_sse
                              ((YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffef8);
          }
          *in_R8 = iVar3;
        }
        if (in_R9 != (long *)0x0) {
          *in_R9 = *in_RSI << 8;
        }
        if ((int)in_RDI[0x13acb] != 0) {
          aom_calc_psnr(in_stack_ffffffffffffff60,(YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff58,
                        (PSNR_STATS *)in_stack_ffffffffffffff50);
          *(undefined4 *)(in_RDI + 0x13ad1) = *(undefined4 *)(in_RDI[0x780d] + 0x24);
          *(int *)((long)in_RDI + 0x9d68c) = (int)in_RDI[0x783d];
          *(undefined4 *)(in_RDI + 0x13ad2) = *(undefined4 *)((long)in_RDI + 0x6029c);
          *(int *)((long)in_RDI + 0x9d694) = (int)*in_RSI << 3;
          in_RDI[0x13ad3] = local_d8;
          in_RDI[0x13ad4] = local_f8;
        }
        local_4 = 0;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    if (local_40 == -1) {
      local_40 = 0;
      if (in_R8 != (int64_t *)0x0) {
        *in_R8 = 0x7fffffffffffffff;
      }
      if (in_R9 != (long *)0x0) {
        *in_R9 = 0x7fffffffffffffff;
      }
      frame_result->global_order_idx = 0;
    }
    local_4 = local_40;
  }
  return local_4;
}

Assistant:

static int encode_with_recode_loop_and_filter(AV1_COMP *cpi, size_t *size,
                                              uint8_t *dest, size_t dest_size,
                                              int64_t *sse, int64_t *rate,
                                              int *largest_tile_id) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_with_or_without_recode_time);
#endif
  for (int i = 0; i < NUM_RECODES_PER_FRAME; i++) {
    cpi->do_update_frame_probs_txtype[i] = 0;
    cpi->do_update_frame_probs_obmc[i] = 0;
    cpi->do_update_frame_probs_warp[i] = 0;
    cpi->do_update_frame_probs_interpfilter[i] = 0;
  }

  cpi->do_update_vbr_bits_off_target_fast = 0;
  int err;
#if CONFIG_REALTIME_ONLY
  err = encode_without_recode(cpi);
#else
  if (cpi->sf.hl_sf.recode_loop == DISALLOW_RECODE)
    err = encode_without_recode(cpi);
  else
    err = encode_with_recode_loop(cpi, size, dest, dest_size);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_with_or_without_recode_time);
#endif
  if (err != AOM_CODEC_OK) {
    if (err == -1) {
      // special case as described in encode_with_recode_loop().
      // Encoding was skipped.
      err = AOM_CODEC_OK;
      if (sse != NULL) *sse = INT64_MAX;
      if (rate != NULL) *rate = INT64_MAX;
      *largest_tile_id = 0;
    }
    return err;
  }

#ifdef OUTPUT_YUV_DENOISED
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  if (oxcf->noise_sensitivity > 0 && denoise_svc(cpi)) {
    aom_write_yuv_frame(yuv_denoised_file,
                        &cpi->denoiser.running_avg_y[INTRA_FRAME]);
  }
#endif

  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;

  // Special case code to reduce pulsing when key frames are forced at a
  // fixed interval. Note the reconstruction error if it is the frame before
  // the force key frame
  if (cpi->ppi->p_rc.next_key_frame_forced && cpi->rc.frames_to_key == 1) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (seq_params->use_highbitdepth) {
      cpi->ambient_err = aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf);
    } else {
      cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
    }
#else
    cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }

  cm->cur_frame->buf.color_primaries = seq_params->color_primaries;
  cm->cur_frame->buf.transfer_characteristics =
      seq_params->transfer_characteristics;
  cm->cur_frame->buf.matrix_coefficients = seq_params->matrix_coefficients;
  cm->cur_frame->buf.monochrome = seq_params->monochrome;
  cm->cur_frame->buf.chroma_sample_position =
      seq_params->chroma_sample_position;
  cm->cur_frame->buf.color_range = seq_params->color_range;
  cm->cur_frame->buf.render_width = cm->render_width;
  cm->cur_frame->buf.render_height = cm->render_height;

  if (!cpi->mt_info.pipeline_lpf_mt_with_enc)
    set_postproc_filter_default_params(&cpi->common);

  if (!cm->features.allow_intrabc) {
    loopfilter_frame(cpi, cm);
  }

  if (cpi->oxcf.mode != ALLINTRA && !cpi->ppi->rtc_ref.non_reference_frame) {
    extend_frame_borders(cpi);
  }

#ifdef OUTPUT_YUV_REC
  aom_write_one_yuv_frame(cm, &cm->cur_frame->buf);
#endif

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_FILM) {
    set_grain_syn_params(cm);
  }

  av1_finalize_encoded_frame(cpi);
  // Build the bitstream
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_pack_bitstream_final_time);
#endif
  cpi->rc.coefficient_size = 0;
  if (av1_pack_bitstream(cpi, dest, dest_size, size, largest_tile_id) !=
      AOM_CODEC_OK)
    return AOM_CODEC_ERROR;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_pack_bitstream_final_time);
#endif

  if (cpi->rc.postencode_drop && allow_postencode_drop_rtc(cpi) &&
      av1_postencode_drop_cbr(cpi, size)) {
    return AOM_CODEC_OK;
  }

  // Compute sse and rate.
  if (sse != NULL) {
#if CONFIG_AV1_HIGHBITDEPTH
    *sse = (seq_params->use_highbitdepth)
               ? aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf)
               : aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#else
    *sse = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }
  if (rate != NULL) {
    const int64_t bits = (*size << 3);
    *rate = (bits << 5);  // To match scale.
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode) {
    PSNR_STATS psnr;
    aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr);
    DuckyEncodeFrameResult *frame_result = &cpi->ducky_encode_info.frame_result;
    frame_result->global_order_idx = cm->cur_frame->display_order_hint;
    frame_result->q_index = cm->quant_params.base_qindex;
    frame_result->rdmult = cpi->rd.RDMULT;
    frame_result->rate = (int)(*size) * 8;
    frame_result->dist = psnr.sse[0];
    frame_result->psnr = psnr.psnr[0];
  }
#endif  // !CONFIG_REALTIME_ONLY

  return AOM_CODEC_OK;
}